

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-xthread-test.c++
# Opt level: O1

Own<const_kj::Executor,_std::nullptr_t> kj::anon_unknown_0::makeDeadExecutor(void)

{
  _func_int **pp_Var1;
  Executor *pEVar2;
  Iface *pIVar3;
  bool bVar4;
  Executor *extraout_RDX;
  Disposer *in_RDI;
  Own<const_kj::Executor,_std::nullptr_t> OVar5;
  PredicateImpl_conflict impl;
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_> executor;
  Thread thread;
  undefined1 local_89;
  _func_int **local_88;
  Executor *pEStack_80;
  undefined8 **local_78;
  Function<void_()> local_70;
  Mutex local_60;
  undefined8 *local_48;
  Fault local_40 [2];
  Thread local_30;
  
  kj::_::Mutex::Mutex(&local_60);
  local_48 = (undefined8 *)0x0;
  local_70.impl.ptr = (Iface *)operator_new(0x10);
  (local_70.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___006315e8;
  local_70.impl.ptr[1]._vptr_Iface = (_func_int **)&local_60;
  local_70.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::makeDeadExecutor()::$_0>>
        ::instance;
  Thread::Thread(&local_30,&local_70);
  pIVar3 = local_70.impl.ptr;
  if (local_70.impl.ptr != (Iface *)0x0) {
    local_70.impl.ptr = (Iface *)0x0;
    (**(local_70.impl.disposer)->_vptr_Disposer)
              (local_70.impl.disposer,pIVar3->_vptr_Iface[-2] + (long)&pIVar3->_vptr_Iface);
  }
  local_88 = (_func_int **)((ulong)local_88 & 0xffffffffffffff00);
  kj::_::Mutex::lock(&local_60,0);
  local_78 = &local_48;
  local_88 = (_func_int **)&PTR_check_00631680;
  pEStack_80 = (Executor *)&local_89;
  local_40[0].exception = local_40[0].exception & 0xffffffffffffff00;
  kj::_::Mutex::wait(&local_60,&local_88);
  if (local_48 == (undefined8 *)0x0) {
    local_40[0].exception = (Exception *)0x0;
    local_88 = (_func_int **)0x0;
    pEStack_80 = (Executor *)0x0;
    kj::_::Debug::Fault::init
              (local_40,(EVP_PKEY_CTX *)
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
              );
  }
  else {
    (**(code **)*local_48)(&local_88);
    pEVar2 = pEStack_80;
    pp_Var1 = local_88;
    if (pEStack_80 != (Executor *)0x0) {
      bVar4 = Executor::isLive(pEStack_80);
      local_88 = (_func_int **)CONCAT71(local_88._1_7_,bVar4);
      if (kj::_::Debug::minSeverity < 3 && !bVar4) {
        kj::_::Debug::log<char_const(&)[58],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
                   ,0x45b,ERROR,
                   "\"failed: expected \" \"KJ_ASSERT_NONNULL(ownExecutor)->isLive()\", _kjCondition"
                   ,(char (*) [58])"failed: expected KJ_ASSERT_NONNULL(ownExecutor)->isLive()",
                   (DebugExpression<bool> *)&local_88);
      }
      local_48 = (undefined8 *)0x0;
      kj::_::Mutex::unlock(&local_60,EXCLUSIVE,(Waiter *)0x0);
      Thread::~Thread(&local_30);
      in_RDI->_vptr_Disposer = pp_Var1;
      in_RDI[1]._vptr_Disposer = (_func_int **)pEVar2;
      kj::_::Mutex::~Mutex(&local_60);
      OVar5.ptr = extraout_RDX;
      OVar5.disposer = in_RDI;
      return OVar5;
    }
    local_40[0].exception = (Exception *)0x0;
    local_88 = (_func_int **)0x0;
    pEStack_80 = (Executor *)0x0;
    kj::_::Debug::Fault::init
              (local_40,(EVP_PKEY_CTX *)
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
              );
  }
  kj::_::Debug::Fault::fatal(local_40);
}

Assistant:

Own<const Executor> makeDeadExecutor() {
  MutexGuarded<Maybe<const Executor&>> executor;  // to get the Executor from the other thread

  // The other thread's executor, owned by the main thread.
  Maybe<Own<const Executor>> ownExecutor;

  {
    Thread thread([&]() noexcept {
      KJ_XTHREAD_TEST_SETUP_LOOP;

      auto lock = executor.lockExclusive();

      // Give our Executor to the main thread.
      *lock = getCurrentThreadExecutor();

      // Wait for the main thread to tell us it addRef-ed the Executor, then exit.
      lock.wait([&](const Maybe<const Executor&>& value) { return value == kj::none; });
    });

    ([&]() noexcept {
      auto lock = executor.lockExclusive();

      // Get the other thread's Executor.
      lock.wait([&](Maybe<const Executor&> value) { return value != kj::none; });
      ownExecutor = (KJ_ASSERT_NONNULL(*lock)).addRef();

      KJ_EXPECT(KJ_ASSERT_NONNULL(ownExecutor)->isLive());

      // Tell the other thread it can exit now.
      *lock = kj::none;
    })();
  }

  return KJ_ASSERT_NONNULL(kj::mv(ownExecutor));
}